

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_checkbox_flags_text(nk_context *ctx,char *text,int len,uint *flags,uint value)

{
  int iVar1;
  uint uVar2;
  int active;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5234,
                  "int nk_checkbox_flags_text(struct nk_context *, const char *, int, unsigned int *, unsigned int)"
                 );
  }
  if (text != (char *)0x0) {
    if (flags != (uint *)0x0) {
      active = *flags & value;
      iVar1 = nk_checkbox_text(ctx,text,len,&active);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        if (active == 0) {
          uVar2 = ~value & *flags;
        }
        else {
          uVar2 = value | *flags;
        }
        *flags = uVar2;
        iVar1 = 1;
      }
      return iVar1;
    }
    __assert_fail("flags",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5236,
                  "int nk_checkbox_flags_text(struct nk_context *, const char *, int, unsigned int *, unsigned int)"
                 );
  }
  __assert_fail("text",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x5235,
                "int nk_checkbox_flags_text(struct nk_context *, const char *, int, unsigned int *, unsigned int)"
               );
}

Assistant:

NK_API int
nk_checkbox_flags_text(struct nk_context *ctx, const char *text, int len,
    unsigned int *flags, unsigned int value)
{
    int active;
    NK_ASSERT(ctx);
    NK_ASSERT(text);
    NK_ASSERT(flags);
    if (!ctx || !text || !flags) return 0;

    active = (int)((*flags & value) & value);
    if (nk_checkbox_text(ctx, text, len, &active)) {
        if (active) *flags |= value;
        else *flags &= ~value;
        return 1;
    }
    return 0;
}